

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

RtAudioErrorType __thiscall
RtApi::openStream(RtApi *this,StreamParameters *oParams,StreamParameters *iParams,
                 RtAudioFormat format,uint sampleRate,uint *bufferFrames,RtAudioCallback callback,
                 void *userData,StreamOptions *options)

{
  pointer pDVar1;
  RtAudioErrorType type;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((this->stream_).state != STREAM_CLOSED) {
    std::__cxx11::string::assign((char *)&this->errorText_);
    type = RTAUDIO_INVALID_USE;
    goto LAB_0010bb83;
  }
  clearStreamInfo(this);
  if (oParams == (StreamParameters *)0x0) {
    if (iParams != (StreamParameters *)0x0) {
LAB_0010b998:
      if (iParams->nChannels != 0) {
        bVar2 = false;
        goto LAB_0010b9ac;
      }
    }
  }
  else if (oParams->nChannels != 0) {
    if (iParams != (StreamParameters *)0x0) goto LAB_0010b998;
    bVar2 = true;
LAB_0010b9ac:
    uVar4 = formatBytes(this,format);
    if (uVar4 != 0) {
      if ((this->deviceList_).
          super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->deviceList_).
          super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
          super__Vector_impl_data._M_start) {
        (*this->_vptr_RtApi[0xb])(this);
      }
      uVar4 = 0;
      uVar7 = 0;
      if (oParams != (StreamParameters *)0x0) {
        uVar7 = (ulong)oParams->nChannels;
        pDVar1 = (this->deviceList_).
                 super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(this->deviceList_).
                       super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x60;
        uVar3 = 0;
        do {
          uVar8 = uVar3;
          if (uVar6 <= uVar8) break;
          uVar3 = (ulong)((int)uVar8 + 1);
        } while (pDVar1[uVar8].ID != oParams->deviceId);
        if (uVar6 == uVar8) goto LAB_0010bb7c;
      }
      if (!bVar2) {
        uVar4 = iParams->nChannels;
        pDVar1 = (this->deviceList_).
                 super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(this->deviceList_).
                       super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x60;
        uVar3 = 0;
        do {
          uVar8 = uVar3;
          if (uVar6 <= uVar8) break;
          uVar3 = (ulong)((int)uVar8 + 1);
        } while (pDVar1[uVar8].ID != iParams->deviceId);
        if (uVar6 == uVar8) goto LAB_0010bb7c;
      }
      if ((((int)uVar7 == 0) ||
          (iVar5 = (*this->_vptr_RtApi[0xc])
                             (this,(ulong)oParams->deviceId,0,uVar7,(ulong)oParams->firstChannel,
                              sampleRate,format,bufferFrames,options), (char)iVar5 != '\0')) &&
         ((uVar4 == 0 ||
          (iVar5 = (*this->_vptr_RtApi[0xc])
                             (this,(ulong)iParams->deviceId,1,(ulong)uVar4,
                              (ulong)iParams->firstChannel,sampleRate,format,bufferFrames,options),
          (char)iVar5 != '\0')))) {
        (this->stream_).callbackInfo.callback = callback;
        (this->stream_).callbackInfo.userData = userData;
        if (options != (StreamOptions *)0x0) {
          options->numberOfBuffers = (this->stream_).nBuffers;
        }
        (this->stream_).state = STREAM_STOPPED;
        return RTAUDIO_NO_ERROR;
      }
      type = RTAUDIO_SYSTEM_ERROR;
      goto LAB_0010bb83;
    }
  }
LAB_0010bb7c:
  std::__cxx11::string::assign((char *)&this->errorText_);
  type = RTAUDIO_INVALID_PARAMETER;
LAB_0010bb83:
  error(this,type);
  return type;
}

Assistant:

RtAudioErrorType RtApi :: openStream( RtAudio::StreamParameters *oParams,
                                      RtAudio::StreamParameters *iParams,
                                      RtAudioFormat format, unsigned int sampleRate,
                                      unsigned int *bufferFrames,
                                      RtAudioCallback callback, void *userData,
                                      RtAudio::StreamOptions *options )
{
  if ( stream_.state != STREAM_CLOSED ) {
    errorText_ = "RtApi::openStream: a stream is already open!";
    return error( RTAUDIO_INVALID_USE );
  }

  // Clear stream information potentially left from a previously open stream.
  clearStreamInfo();

  if ( oParams && oParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL output StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( iParams && iParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL input StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( oParams == NULL && iParams == NULL ) {
    errorText_ = "RtApi::openStream: input and output StreamParameters structures are both NULL!";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( formatBytes(format) == 0 ) {
    errorText_ = "RtApi::openStream: 'format' parameter value is undefined.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  // Scan devices if none currently listed.
  if ( deviceList_.size() == 0 ) probeDevices();
  
  unsigned int m, oChannels = 0;
  if ( oParams ) {
    oChannels = oParams->nChannels;
    // Verify that the oParams->deviceId is found in our list
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == oParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: output device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  unsigned int iChannels = 0;
  if ( iParams ) {
    iChannels = iParams->nChannels;
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == iParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: input device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  bool result;

  if ( oChannels > 0 ) {

    result = probeDeviceOpen( oParams->deviceId, OUTPUT, oChannels, oParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  if ( iChannels > 0 ) {

    result = probeDeviceOpen( iParams->deviceId, INPUT, iChannels, iParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  stream_.callbackInfo.callback = (void *) callback;
  stream_.callbackInfo.userData = userData;

  if ( options ) options->numberOfBuffers = stream_.nBuffers;
  stream_.state = STREAM_STOPPED;
  return RTAUDIO_NO_ERROR;
}